

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void UpdateCostAtIndex(CostManager *manager,int i,int do_clean_intervals)

{
  int in_EDX;
  int in_ESI;
  CostManager *in_RDI;
  CostInterval *next;
  CostInterval *current;
  undefined7 in_stack_ffffffffffffffd8;
  bool bVar1;
  CostManager *manager_00;
  CostManager *local_18;
  
  local_18 = (CostManager *)in_RDI->head;
  while( true ) {
    bVar1 = false;
    if (local_18 != (CostManager *)0x0) {
      bVar1 = local_18->count <= in_ESI;
    }
    if (bVar1 == false) break;
    manager_00 = (CostManager *)local_18->cost_cache[0];
    if (in_ESI < *(int *)&local_18->field_0xc) {
      UpdateCost(in_RDI,in_ESI,*(int *)&local_18->cache_intervals,(int64_t)local_18->head);
      local_18 = manager_00;
    }
    else {
      local_18 = manager_00;
      if (in_EDX != 0) {
        PopInterval(manager_00,(CostInterval *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
        local_18 = manager_00;
      }
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void UpdateCostAtIndex(CostManager* const manager, int i,
                                          int do_clean_intervals) {
  CostInterval* current = manager->head;

  while (current != NULL && current->start <= i) {
    CostInterval* const next = current->next;
    if (current->end <= i) {
      if (do_clean_intervals) {
        // We have an outdated interval, remove it.
        PopInterval(manager, current);
      }
    } else {
      UpdateCost(manager, i, current->index, current->cost);
    }
    current = next;
  }
}